

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O1

char * archive_entry_copy_fflags_text_len(archive_entry *entry,char *flags,size_t flags_length)

{
  int iVar1;
  byte *pbVar2;
  byte *pbVar3;
  size_t sVar4;
  byte *pbVar5;
  size_t __n;
  unsigned_long *puVar6;
  char *__s;
  bool bVar7;
  bool bVar8;
  ulong local_68;
  ulong local_60;
  size_t local_48;
  
  archive_mstring_copy_mbs_len(&entry->ae_fflags_text,flags,flags_length);
  local_48 = flags_length;
  if (flags_length != 0) {
    pbVar5 = (byte *)(flags + flags_length);
    do {
      if ((0x2c < (ulong)(byte)*flags) ||
         ((0x100100000200U >> ((ulong)(byte)*flags & 0x3f) & 1) == 0)) goto LAB_00117483;
      flags = (char *)((byte *)flags + 1);
      local_48 = local_48 - 1;
    } while (local_48 != 0);
    local_48 = 0;
    flags = (char *)pbVar5;
  }
LAB_00117483:
  if (local_48 == 0) {
    local_60 = 0;
    local_68 = 0;
    pbVar5 = (byte *)0x0;
  }
  else {
    local_68 = 0;
    local_60 = 0;
    pbVar2 = (byte *)0x0;
    do {
      pbVar5 = (byte *)flags + local_48;
      pbVar3 = (byte *)flags;
      do {
        if (((ulong)*pbVar3 < 0x2d) && ((0x100100000200U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))
        goto LAB_001174d5;
        pbVar3 = pbVar3 + 1;
        local_48 = local_48 - 1;
      } while (local_48 != 0);
      local_48 = 0;
      pbVar3 = pbVar5;
LAB_001174d5:
      __n = (long)pbVar3 - (long)flags;
      bVar8 = false;
      puVar6 = &fileflags[0].set;
      __s = "nosappnd";
      do {
        sVar4 = strlen(__s);
        if ((__n == sVar4) && (iVar1 = bcmp(flags,__s,__n), iVar1 == 0)) {
          local_68 = local_68 | *puVar6;
          local_60 = local_60 | puVar6[1];
          bVar7 = false;
        }
        else {
          bVar7 = true;
          if (__n == sVar4 - 2) {
            iVar1 = bcmp(flags,__s + 2,__n);
            bVar7 = iVar1 != 0;
            if (!bVar7) {
              local_60 = local_60 | *puVar6;
              local_68 = local_68 | puVar6[1];
            }
          }
        }
        if (!bVar7) break;
        __s = (char *)puVar6[2];
        puVar6 = puVar6 + 4;
        bVar8 = __s == (char *)0x0;
      } while (!bVar8);
      if (pbVar2 != (byte *)0x0) {
        flags = (char *)pbVar2;
      }
      pbVar5 = (byte *)flags;
      if (!bVar8) {
        pbVar5 = pbVar2;
      }
      flags = (char *)pbVar3;
      if (local_48 != 0) {
        pbVar2 = pbVar3 + local_48;
        do {
          flags = (char *)pbVar3;
          if ((0x2c < (ulong)*pbVar3) || ((0x100100000200U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0))
          goto LAB_001175fb;
          pbVar3 = pbVar3 + 1;
          local_48 = local_48 - 1;
        } while (local_48 != 0);
        local_48 = 0;
        flags = (char *)pbVar2;
      }
LAB_001175fb:
      pbVar2 = pbVar5;
    } while (local_48 != 0);
  }
  entry->ae_fflags_set = local_60;
  entry->ae_fflags_clear = local_68;
  return (char *)pbVar5;
}

Assistant:

const char *
archive_entry_copy_fflags_text_len(struct archive_entry *entry,
    const char *flags, size_t flags_length)
{
	archive_mstring_copy_mbs_len(&entry->ae_fflags_text, flags, flags_length);
	return (ae_strtofflags(flags, flags_length,
		    &entry->ae_fflags_set, &entry->ae_fflags_clear));
}